

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm_fold.c
# Opt level: O2

uint32_t nexttoken(char **pp,int allowlit,int allowany)

{
  char cVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *__s;
  uint32_t uVar7;
  uint uVar8;
  uint32_t j;
  ulong uVar9;
  
  __s = *pp;
  if (__s == (char *)0x0) {
    return 0;
  }
  pcVar4 = strchr(__s,0x20);
  if (pcVar4 == (char *)0x0) {
    pcVar6 = (char *)0x0;
  }
  else {
    pcVar6 = pcVar4 + 1;
    *pcVar4 = '\0';
  }
  *pp = pcVar6;
  if (allowlit != 0) {
    iVar2 = strncmp(__s,"IRFPM_",6);
    if (iVar2 == 0) {
      for (uVar8 = 0; irfpm_names[uVar8] != (char *)0x0; uVar8 = uVar8 + 1) {
        iVar2 = strcmp(irfpm_names[uVar8],__s + 6);
        if (iVar2 == 0) {
          return uVar8;
        }
      }
      goto LAB_0010be41;
    }
    iVar2 = strncmp(__s,"IRFL_",5);
    if (iVar2 == 0) {
      for (uVar8 = 0; irfield_names[uVar8] != (char *)0x0; uVar8 = uVar8 + 1) {
        iVar2 = strcmp(irfield_names[uVar8],__s + 5);
        if (iVar2 == 0) {
          return uVar8;
        }
      }
      goto LAB_0010be41;
    }
    iVar2 = strncmp(__s,"IRCALL_",7);
    if (iVar2 == 0) {
      for (uVar8 = 0; ircall_names[uVar8] != (char *)0x0; uVar8 = uVar8 + 1) {
        iVar2 = strcmp(ircall_names[uVar8],__s + 7);
        if (iVar2 == 0) {
          return uVar8;
        }
      }
      goto LAB_0010be41;
    }
    iVar2 = strncmp(__s,"IRCONV_",7);
    if (iVar2 == 0) {
      pcVar4 = __s + 7;
      iVar2 = 0;
      for (uVar8 = 0; pcVar6 = irt_names[uVar8], pcVar6 != (char *)0x0; uVar8 = uVar8 + 1) {
        pcVar5 = strchr(pcVar4,0x5f);
        if ((pcVar5 != (char *)0x0) &&
           (iVar3 = strncmp(pcVar6,pcVar4,(long)pcVar5 - (long)pcVar4), iVar3 == 0)) {
          uVar9 = 0;
          while( true ) {
            if (irt_names[uVar9] == (char *)0x0) break;
            iVar3 = strcmp(irt_names[uVar9],pcVar5 + 1);
            if (iVar3 == 0) {
              return iVar2 + (int)uVar9;
            }
            uVar9 = (ulong)((int)uVar9 + 1);
          }
        }
        iVar2 = iVar2 + 0x20;
      }
      goto LAB_0010be41;
    }
    cVar1 = *__s;
    if ((byte)(cVar1 - 0x30U) < 10) {
      uVar7 = 0;
      while ((byte)(cVar1 - 0x30U) < 10) {
        uVar7 = (uint)(byte)(cVar1 - 0x30U) + uVar7 * 10;
        pcVar4 = __s + 1;
        __s = __s + 1;
        cVar1 = *pcVar4;
      }
      if (cVar1 == '\0') {
        return uVar7;
      }
      goto LAB_0010be41;
    }
  }
  if ((allowany != 0) && (iVar2 = strcmp("any",__s), iVar2 == 0)) {
    return allowany;
  }
  for (uVar8 = 0; ir_names[uVar8] != (char *)0x0; uVar8 = uVar8 + 1) {
    iVar2 = strcmp(ir_names[uVar8],__s);
    if (iVar2 == 0) {
      return uVar8;
    }
  }
LAB_0010be41:
  fprintf(_stderr,"Error: bad fold definition token \"%s\" at line %d\n",__s,(ulong)(uint)lineno);
  exit(1);
}

Assistant:

static uint32_t nexttoken(char **pp, int allowlit, int allowany)
{
  char *p = *pp;
  if (p) {
    uint32_t i;
    char *q = strchr(p, ' ');
    if (q) *q++ = '\0';
    *pp = q;
    if (allowlit && !strncmp(p, "IRFPM_", 6)) {
      for (i = 0; irfpm_names[i]; i++)
	if (!strcmp(irfpm_names[i], p+6))
	  return i;
    } else if (allowlit && !strncmp(p, "IRFL_", 5)) {
      for (i = 0; irfield_names[i]; i++)
	if (!strcmp(irfield_names[i], p+5))
	  return i;
    } else if (allowlit && !strncmp(p, "IRCALL_", 7)) {
      for (i = 0; ircall_names[i]; i++)
	if (!strcmp(ircall_names[i], p+7))
	  return i;
    } else if (allowlit && !strncmp(p, "IRCONV_", 7)) {
      for (i = 0; irt_names[i]; i++) {
	const char *r = strchr(p+7, '_');
	if (r && !strncmp(irt_names[i], p+7, r-(p+7))) {
	  uint32_t j;
	  for (j = 0; irt_names[j]; j++)
	    if (!strcmp(irt_names[j], r+1))
	      return (i << 5) + j;
	}
      }
    } else if (allowlit && *p >= '0' && *p <= '9') {
      for (i = 0; *p >= '0' && *p <= '9'; p++)
	i = i*10 + (*p - '0');
      if (*p == '\0')
	return i;
    } else if (allowany && !strcmp("any", p)) {
      return allowany;
    } else {
      for (i = 0; ir_names[i]; i++)
	if (!strcmp(ir_names[i], p))
	  return i;
    }
    fprintf(stderr, "Error: bad fold definition token \"%s\" at line %d\n", p, lineno);
    exit(1);
  }
  return 0;
}